

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O0

string * genId_abi_cxx11_(void)

{
  reference pvVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *in_RDI;
  string newid;
  string *pid_str;
  size_type in_stack_00001338;
  size_type in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffffac;
  
  gmlc::utilities::randomString_abi_cxx11_(in_stack_00001338);
  pvVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  *pvVar1 = '-';
  pvVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  *pvVar1 = '-';
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  *(value_type *)&(__lhs->_M_dataplus)._M_p = '-';
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  *(value_type *)&(__rhs->_M_dataplus)._M_p = '-';
  getpid();
  CLI::std::__cxx11::to_string(in_stack_ffffffffffffffac);
  std::operator+(__lhs,__rhs);
  std::__cxx11::string::~string(__rhs);
  std::__cxx11::string::~string(__rhs);
  return in_RDI;
}

Assistant:

static inline std::string genId()
{
    std::string newid = gmlc::utilities::randomString(24);

    newid[0] = '-';
    newid[6] = '-';
    newid[12] = '-';
    newid[18] = '-';

#ifdef _WIN32
    std::string pid_str = std::to_string(GetCurrentProcessId()) + newid;
#else
    std::string pid_str = std::to_string(getpid()) + newid;
#endif
    return pid_str;
}